

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLcode concat_url(char *base,char *relurl,char **newurl)

{
  bool bVar1;
  CURLcode CVar2;
  CURLUcode CVar3;
  char *sep;
  char *pcVar4;
  char *pcVar5;
  size_t len;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  dynbuf newest;
  _Bool local_5c;
  dynbuf local_50;
  
  *newurl = (char *)0x0;
  pcVar4 = strstr(base,"//");
  pcVar6 = pcVar4 + 2;
  if (pcVar4 == (char *)0x0) {
    pcVar6 = base;
  }
  if (*relurl == '/') {
    if (relurl[1] == '/') {
      *pcVar6 = '\0';
      relurl = relurl + 2;
      local_5c = false;
    }
    else {
      pcVar4 = strchr(pcVar6,0x2f);
      pcVar5 = strchr(pcVar6,0x3f);
      if (pcVar4 == (char *)0x0) {
        if (pcVar5 != (char *)0x0) {
          local_5c = true;
          *pcVar5 = '\0';
          goto LAB_001668b9;
        }
      }
      else {
        pcVar7 = pcVar4;
        if (pcVar5 < pcVar4) {
          pcVar7 = pcVar5;
        }
        if (pcVar5 == (char *)0x0) {
          pcVar7 = pcVar4;
        }
        *pcVar7 = '\0';
      }
LAB_001668b3:
      local_5c = true;
    }
LAB_001668b9:
    bVar1 = false;
  }
  else {
    pcVar4 = strchr(pcVar6,0x3f);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
    }
    if ((*relurl != '#') && (*relurl != '?')) {
      pcVar4 = strrchr(pcVar6,0x2f);
      if (pcVar4 != (char *)0x0) {
        *pcVar4 = '\0';
      }
      pcVar4 = strchr(pcVar6,0x2f);
      pcVar6 = pcVar4 + 1;
      if (pcVar4 == (char *)0x0) {
        pcVar6 = (char *)0x0;
      }
      if (*relurl == '.') {
        relurl = relurl + (ulong)(relurl[1] == '/') * 2;
      }
      iVar8 = 0;
      if (*relurl == '.') {
        iVar8 = 0;
        pcVar5 = relurl;
        do {
          relurl = pcVar5;
          if ((pcVar5[1] != '.') || (pcVar5[2] != '/')) break;
          iVar8 = iVar8 + 1;
          relurl = pcVar5 + 3;
          pcVar7 = pcVar5 + 3;
          pcVar5 = relurl;
        } while (*pcVar7 == '.');
      }
      if (pcVar4 != (char *)0x0) {
        for (; iVar8 != 0; iVar8 = iVar8 + -1) {
          pcVar4 = strrchr(pcVar6,0x2f);
          if (pcVar4 == (char *)0x0) {
            local_5c = true;
            *pcVar6 = '\0';
            goto LAB_001668b9;
          }
          *pcVar4 = '\0';
        }
        goto LAB_001668b3;
      }
      local_5c = true;
      pcVar6 = (char *)0x0;
      goto LAB_001668b9;
    }
    local_5c = true;
    bVar1 = true;
  }
  Curl_dyn_init(&local_50,8000000);
  CVar2 = Curl_dyn_add(&local_50,base);
  if (CVar2 != CURLE_OK) {
    return CVar2;
  }
  if (*relurl != '/') {
    if (pcVar6 == (char *)0x0) {
      if (bVar1) goto LAB_001669e6;
    }
    else if (bVar1 || *pcVar6 == '\0') goto LAB_001669e6;
    CVar2 = Curl_dyn_addn(&local_50,"/",1);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
  }
LAB_001669e6:
  len = strlen(relurl);
  CVar2 = CURLE_OK;
  CVar3 = urlencode_str(&local_50,relurl,len,local_5c,false);
  if (CVar3 == CURLUE_OK) {
    pcVar6 = Curl_dyn_ptr(&local_50);
    *newurl = pcVar6;
  }
  else {
    CVar2 = CURLE_OUT_OF_MEMORY;
    if (CVar3 == CURLUE_TOO_LARGE) {
      CVar2 = CURLE_TOO_LARGE;
    }
  }
  return CVar2;
}

Assistant:

static CURLcode concat_url(char *base, const char *relurl, char **newurl)
{
  /***
   TRY to append this new path to the old URL
   to the right of the host part. Oh crap, this is doomed to cause
   problems in the future...
  */
  struct dynbuf newest;
  char *protsep;
  char *pathsep;
  bool host_changed = FALSE;
  const char *useurl = relurl;
  CURLcode result = CURLE_OK;
  CURLUcode uc;
  bool skip_slash = FALSE;
  *newurl = NULL;

  /* protsep points to the start of the hostname */
  protsep = strstr(base, "//");
  if(!protsep)
    protsep = base;
  else
    protsep += 2; /* pass the slashes */

  if('/' != relurl[0]) {
    int level = 0;

    /* First we need to find out if there is a ?-letter in the URL,
       and cut it and the right-side of that off */
    pathsep = strchr(protsep, '?');
    if(pathsep)
      *pathsep = 0;

    /* we have a relative path to append to the last slash if there is one
       available, or the new URL is just a query string (starts with a '?') or
       a fragment (starts with '#') we append the new one at the end of the
       current URL */
    if((useurl[0] != '?') && (useurl[0] != '#')) {
      pathsep = strrchr(protsep, '/');
      if(pathsep)
        *pathsep = 0;

      /* Check if there is any slash after the hostname, and if so, remember
         that position instead */
      pathsep = strchr(protsep, '/');
      if(pathsep)
        protsep = pathsep + 1;
      else
        protsep = NULL;

      /* now deal with one "./" or any amount of "../" in the newurl
         and act accordingly */

      if((useurl[0] == '.') && (useurl[1] == '/'))
        useurl += 2; /* just skip the "./" */

      while((useurl[0] == '.') &&
            (useurl[1] == '.') &&
            (useurl[2] == '/')) {
        level++;
        useurl += 3; /* pass the "../" */
      }

      if(protsep) {
        while(level--) {
          /* cut off one more level from the right of the original URL */
          pathsep = strrchr(protsep, '/');
          if(pathsep)
            *pathsep = 0;
          else {
            *protsep = 0;
            break;
          }
        }
      }
    }
    else
      skip_slash = TRUE;
  }
  else {
    /* We got a new absolute path for this server */

    if(relurl[1] == '/') {
      /* the new URL starts with //, just keep the protocol part from the
         original one */
      *protsep = 0;
      useurl = &relurl[2]; /* we keep the slashes from the original, so we
                              skip the new ones */
      host_changed = TRUE;
    }
    else {
      /* cut off the original URL from the first slash, or deal with URLs
         without slash */
      pathsep = strchr(protsep, '/');
      if(pathsep) {
        /* When people use badly formatted URLs, such as
           "http://www.example.com?dir=/home/daniel" we must not use the first
           slash, if there is a ?-letter before it! */
        char *sep = strchr(protsep, '?');
        if(sep && (sep < pathsep))
          pathsep = sep;
        *pathsep = 0;
      }
      else {
        /* There was no slash. Now, since we might be operating on a badly
           formatted URL, such as "http://www.example.com?id=2380" which does
           not use a slash separator as it is supposed to, we need to check
           for a ?-letter as well! */
        pathsep = strchr(protsep, '?');
        if(pathsep)
          *pathsep = 0;
      }
    }
  }

  Curl_dyn_init(&newest, CURL_MAX_INPUT_LENGTH);

  /* copy over the root URL part */
  result = Curl_dyn_add(&newest, base);
  if(result)
    return result;

  /* check if we need to append a slash */
  if(('/' == useurl[0]) || (protsep && !*protsep) || skip_slash)
    ;
  else {
    result = Curl_dyn_addn(&newest, "/", 1);
    if(result)
      return result;
  }

  /* then append the new piece on the right side */
  uc = urlencode_str(&newest, useurl, strlen(useurl), !host_changed,
                     FALSE);
  if(uc)
    return (uc == CURLUE_TOO_LARGE) ? CURLE_TOO_LARGE : CURLE_OUT_OF_MEMORY;

  *newurl = Curl_dyn_ptr(&newest);
  return CURLE_OK;
}